

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

char * __thiscall FileReader::GetsFromBuffer(FileReader *this,char *bufptr,char *strbuf,int len)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  
  lVar2 = this->Length - this->FilePos;
  if (lVar2 < len) {
    len = (int)lVar2;
  }
  if (0 < len) {
    pcVar3 = strbuf;
    if (len != 1) {
      do {
        lVar2 = this->FilePos;
        cVar1 = bufptr[lVar2];
        if (cVar1 != '\r') {
          if (cVar1 != '\0') {
            *pcVar3 = cVar1;
            pcVar3 = pcVar3 + 1;
            lVar2 = this->FilePos;
            if (bufptr[lVar2] != '\n') {
              len = len + -1;
              goto LAB_003852de;
            }
          }
          this->FilePos = lVar2 + 1;
          break;
        }
LAB_003852de:
        this->FilePos = this->FilePos + 1;
      } while (1 < len);
    }
    if (pcVar3 != strbuf) {
      *pcVar3 = '\0';
      return strbuf;
    }
  }
  return (char *)0x0;
}

Assistant:

char *FileReader::GetsFromBuffer(const char * bufptr, char *strbuf, int len)
{
	if (len>Length-FilePos) len=Length-FilePos;
	if (len <= 0) return NULL;

	char *p = strbuf;
	while (len > 1)
	{
		if (bufptr[FilePos] == 0)
		{
			FilePos++;
			break;
		}
		if (bufptr[FilePos] != '\r')
		{
			*p++ = bufptr[FilePos];
			len--;
			if (bufptr[FilePos] == '\n') 
			{
				FilePos++;
				break;
			}
		}
		FilePos++;
	}
	if (p==strbuf) return NULL;
	*p++=0;
	return strbuf;
}